

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Buffer.cxx
# Opt level: O2

int __thiscall Fl_Text_Buffer::skip_lines(Fl_Text_Buffer *this,int startPos,int nLines)

{
  uint uVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  ulong uVar6;
  
  uVar4 = (ulong)(uint)startPos;
  if (nLines != 0) {
    iVar5 = 0;
    for (uVar3 = (ulong)startPos; (long)uVar3 < (long)this->mGapStart; uVar3 = uVar3 + 1) {
      if ((this->mBuf[uVar3] == '\n') && (iVar5 = iVar5 + 1, iVar5 == nLines)) {
        return (int)uVar3 + 1;
      }
    }
    uVar1 = this->mLength;
    uVar6 = uVar3 & 0xffffffff;
    if ((int)uVar3 < (int)uVar1) {
      uVar6 = (ulong)uVar1;
    }
    do {
      uVar4 = uVar6;
      if ((long)(int)uVar1 <= (long)uVar3) break;
      uVar4 = uVar3 + 1;
      lVar2 = uVar3 + (long)(this->mGapEnd - this->mGapStart);
      uVar3 = uVar4;
    } while ((this->mBuf[lVar2] != '\n') || (iVar5 = iVar5 + 1, iVar5 < nLines));
  }
  return (int)uVar4;
}

Assistant:

int Fl_Text_Buffer::skip_lines(int startPos, int nLines)
{
  IS_UTF8_ALIGNED2(this, (startPos))
  
  if (nLines == 0)
    return startPos;
  
  int gapLen = mGapEnd - mGapStart;
  int pos = startPos;
  int lineCount = 0;
  while (pos < mGapStart) {
    if (mBuf[pos++] == '\n') {
      lineCount++;
      if (lineCount == nLines) {
        IS_UTF8_ALIGNED2(this, (pos))
	return pos;
      }
    }
  }
  while (pos < mLength) {
    if (mBuf[pos++ + gapLen] == '\n') {
      lineCount++;
      if (lineCount >= nLines) {
        IS_UTF8_ALIGNED2(this, (pos))
	return pos;
      }
    }
  }
  IS_UTF8_ALIGNED2(this, (pos))
  return pos;
}